

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control.cpp
# Opt level: O0

void __thiscall Control::Control(Control *this,int type_,string *name_)

{
  string local_40 [32];
  string *local_20;
  string *name__local;
  Control *pCStack_10;
  int type__local;
  Control *this_local;
  
  local_20 = name_;
  name__local._4_4_ = type_;
  pCStack_10 = this;
  std::__cxx11::string::string(local_40,(string *)name_);
  Element::Element(&this->super_Element,(string *)local_40);
  std::__cxx11::string::~string(local_40);
  (this->super_Element)._vptr_Element = (_func_int **)&PTR__Control_0019eb48;
  *(int *)&(this->super_Element).field_0x2c = name__local._4_4_;
  this->link = (Link *)0x0;
  this->status = 2;
  this->setting = 0.0;
  this->node = (Node *)0x0;
  this->head = 0.0;
  this->volume = 0.0;
  this->levelType = NO_LEVEL;
  this->time = 0;
  return;
}

Assistant:

Control::Control(int type_, string name_) :
    Element(name_),
    type(type_),
    link(nullptr),
    status(NO_STATUS),
    setting(0.0),
    node(nullptr),
    head(0.0),
    volume(0.0),
    levelType(NO_LEVEL),
    time(0)
{
}